

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

bool testing::internal::ParseInt32(Message *src_text,char *str,int32_t *value)

{
  long lVar1;
  Message *pMVar2;
  ostream *poVar3;
  char *local_58;
  char *end;
  char *local_30;
  char *str_local;
  Message msg;
  
  local_58 = (char *)0x0;
  local_30 = str;
  lVar1 = strtol(str,&local_58,10);
  if (*local_58 == '\0') {
    if ((int)lVar1 == lVar1) {
      *value = (int)lVar1;
      return true;
    }
    Message::Message((Message *)&str_local);
    poVar3 = (ostream *)(str_local + 0x10);
    std::operator<<(poVar3,"WARNING: ");
    testing::operator<<(poVar3,src_text);
    std::operator<<(poVar3," is expected to be a 32-bit integer, but actually");
    std::operator<<(poVar3," has value ");
    pMVar2 = Message::operator<<((Message *)&str_local,&local_30);
    Message::operator<<(pMVar2,(char (*) [20])", which overflows.\n");
    StringStreamToString((string *)&end,(stringstream *)str_local);
  }
  else {
    Message::Message((Message *)&str_local);
    poVar3 = (ostream *)(str_local + 0x10);
    std::operator<<(poVar3,"WARNING: ");
    testing::operator<<(poVar3,src_text);
    std::operator<<(poVar3," is expected to be a 32-bit integer, but actually");
    std::operator<<(poVar3," has value \"");
    pMVar2 = Message::operator<<((Message *)&str_local,&local_30);
    Message::operator<<(pMVar2,(char (*) [4])"\".\n");
    StringStreamToString((string *)&end,(stringstream *)str_local);
  }
  printf("%s",end);
  std::__cxx11::string::~string((string *)&end);
  fflush(_stdout);
  if (str_local != (char *)0x0) {
    (**(code **)(*(long *)str_local + 8))();
  }
  return false;
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, int32_t* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an int32_t?
  const auto result = static_cast<int32_t>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an int32_t.
  ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}